

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_memory.cpp
# Opt level: O1

void * gim_realloc(void *ptr,size_t oldsize,size_t newsize)

{
  void *__dest;
  
  if (g_allocfn == (undefined1 *)0x0) {
    __dest = malloc(newsize);
  }
  else {
    __dest = (void *)(*(code *)g_allocfn)();
  }
  if (oldsize < newsize) {
    newsize = oldsize;
  }
  memcpy(__dest,ptr,newsize);
  if (ptr != (void *)0x0) {
    if (g_freefn == (gim_free_function *)0x0) {
      free(ptr);
    }
    else {
      (*g_freefn)(ptr);
    }
  }
  return __dest;
}

Assistant:

void * gim_realloc(void *ptr, size_t oldsize, size_t newsize)
{
 	void * newptr = gim_alloc(newsize);
    size_t copysize = oldsize<newsize?oldsize:newsize;
    gim_simd_memcpy(newptr,ptr,copysize);
    gim_free(ptr);
    return newptr;
}